

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O0

int __thiscall
icu_63::RuleBasedNumberFormat::clone
          (RuleBasedNumberFormat *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  RuleBasedNumberFormat *this_00;
  undefined8 local_30;
  RuleBasedNumberFormat *this_local;
  
  this_00 = (RuleBasedNumberFormat *)UMemory::operator_new((UMemory *)0x2f0,(size_t)__fn);
  local_30 = (RuleBasedNumberFormat *)0x0;
  if (this_00 != (RuleBasedNumberFormat *)0x0) {
    RuleBasedNumberFormat(this_00,this);
    local_30 = this_00;
  }
  return (int)local_30;
}

Assistant:

Format*
RuleBasedNumberFormat::clone(void) const
{
    return new RuleBasedNumberFormat(*this);
}